

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

b_str<char> *
detail::operator|(b_str<char> *__return_storage_ptr__,b_str<char> *str,
                 split_helper_subroutine<detail::split_at_first_back,_char,_char> *info)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find((char)str,(ulong)(uint)(int)info->delim);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::find_first_not_of((char)str,(ulong)(uint)(int)info->delim);
    std::__cxx11::string::erase((ulong)str,0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}